

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

const_iterator __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::find(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
       *this,QAbstractButton **key)

{
  long lVar1;
  bool bVar2;
  QAbstractButton **ppQVar3;
  QAbstractButton **in_RSI;
  less<QAbstractButton_*> *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  const_iterator *in_stack_ffffffffffffff98;
  const_iterator *in_stack_ffffffffffffffa0;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *in_stack_ffffffffffffffa8;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *this_00;
  const_iterator local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = lower_bound((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                          *)in_RDI,in_RSI);
  end(in_stack_ffffffffffffffa8);
  bVar2 = const_iterator::operator!=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar2) {
    this_00 = (QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
               *)*in_RSI;
    ppQVar3 = const_iterator::key((const_iterator *)0x6749a6);
    bVar2 = std::less<QAbstractButton_*>::operator()(in_RDI,(QAbstractButton *)this_00,*ppQVar3);
    if (bVar2) {
      local_18 = end(this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

const_iterator find(const Key &key) const
    {
        auto it = lower_bound(key);
        if (it != end()) {
            if (!key_compare::operator()(key, it.key()))
                return it;
            it = end();
        }
        return it;
    }